

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

iterator_range<llvm::AppleAcceleratorTable::ValueIterator> * __thiscall
llvm::AppleAcceleratorTable::equal_range
          (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *__return_storage_ptr__,
          AppleAcceleratorTable *this,StringRef Key)

{
  DWARFDataExtractor *this_00;
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  char *Str;
  Entry *this_01;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  StringRef Buffer;
  StringRef LHS;
  ValueIterator local_548;
  ValueIterator local_480;
  ValueIterator local_3b8;
  ValueIterator local_2f0;
  ValueIterator local_228;
  ValueIterator local_160;
  uint64_t local_98;
  uint64_t BucketOffset;
  uint64_t local_80;
  uint64_t HashOffset;
  uint64_t OffsetsOffset;
  uint64_t StringOffset;
  long local_60;
  char *local_58;
  llvm *local_50;
  DataExtractor *local_48;
  ulong local_40;
  uint64_t DataOffset;
  
  if (this->IsValid == false) {
    memset(&local_3b8,0,0xb0);
    local_3b8.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01127b90;
    local_3b8.Data = 0;
    local_3b8.NumData = 0;
    local_3b8.Current.HdrData = (HeaderData *)0x0;
    local_3b8.DataOffset = 0;
    local_3b8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         &local_3b8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_3b8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    memset(&local_2f0,0,0xb0);
    local_2f0.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         &local_2f0.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_2f0.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01127b90;
    local_2f0.Current.HdrData = (HeaderData *)0x0;
    local_2f0.DataOffset = 0;
    local_2f0.Data = 0;
    local_2f0.NumData = 0;
    local_2f0.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    make_range<llvm::AppleAcceleratorTable::ValueIterator>
              (__return_storage_ptr__,&local_3b8,&local_2f0);
    DWARFAcceleratorTable::Entry::~Entry(&local_2f0.Current.super_Entry);
    this_01 = &local_3b8.Current.super_Entry;
  }
  else {
    Buffer.Length = 0x1505;
    Buffer.Data = (char *)Key.Length;
    local_58 = (char *)Key.Length;
    local_50 = (llvm *)Key.Data;
    DataOffset = (uint64_t)__return_storage_ptr__;
    uVar3 = djbHash((llvm *)Key.Data,Buffer,(uint32_t)Key.Length);
    uVar1 = (this->Hdr).BucketCount;
    StringOffset = (ulong)uVar3 % (ulong)uVar1;
    uVar6 = (ulong)(this->Hdr).HeaderDataLength;
    local_60 = (uVar1 << 2) + uVar6 + 0x14;
    lVar4 = (ulong)((this->Hdr).HashCount << 2) + local_60;
    local_98 = uVar6 + (uint)((int)StringOffset * 4) + 0x14;
    this_00 = &(this->super_DWARFAcceleratorTable).AccelSection;
    uVar3 = DataExtractor::getU32(&this_00->super_DataExtractor,&local_98,(Error *)0x0);
    local_48 = &(this->super_DWARFAcceleratorTable).StringSection;
    uVar5 = (ulong)uVar3;
    uVar6 = uVar5 * 4;
    for (; uVar5 < (this->Hdr).HashCount; uVar5 = uVar5 + 1) {
      local_80 = local_60 + (uVar6 & 0xffffffff);
      HashOffset = (uVar6 & 0xffffffff) + lVar4;
      uVar3 = DataExtractor::getU32(&this_00->super_DataExtractor,&local_80,(Error *)0x0);
      if (uVar3 % (this->Hdr).BucketCount != (uint)StringOffset) break;
      uVar3 = DataExtractor::getU32(&this_00->super_DataExtractor,&HashOffset,(Error *)0x0);
      local_40 = (ulong)uVar3;
      OffsetsOffset =
           DWARFDataExtractor::getRelocatedValue(this_00,4,&local_40,(uint64_t *)0x0,(Error *)0x0);
      if (OffsetsOffset == 0) break;
      Str = DataExtractor::getCStr(local_48,&OffsetsOffset);
      StringRef::StringRef((StringRef *)&BucketOffset,Str);
      LHS.Length = (size_t)local_58;
      LHS.Data = (char *)local_50;
      bVar2 = llvm::operator==(LHS,_BucketOffset);
      if (bVar2) {
        ValueIterator::ValueIterator(&local_548,this,local_40);
        memset(&local_480,0,0xb0);
        __return_storage_ptr__ =
             (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *)DataOffset;
        local_480.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity =
             3;
        local_480.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01127b90;
        local_480.Current.HdrData = (HeaderData *)0x0;
        local_480.DataOffset = 0;
        local_480.Data = 0;
        local_480.NumData = 0;
        local_480.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
             &local_480.Current.super_Entry.Values.
              super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
        make_range<llvm::AppleAcceleratorTable::ValueIterator>
                  ((iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *)DataOffset,
                   &local_548,&local_480);
        DWARFAcceleratorTable::Entry::~Entry(&local_480.Current.super_Entry);
        this_01 = &local_548.Current.super_Entry;
        goto LAB_00d75674;
      }
      uVar6 = uVar6 + 4;
    }
    memset(&local_228,0,0xb0);
    local_228.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01127b90;
    local_228.Data = 0;
    local_228.NumData = 0;
    local_228.Current.HdrData = (HeaderData *)0x0;
    local_228.DataOffset = 0;
    local_228.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         &local_228.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_228.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    memset(&local_160,0,0xb0);
    __return_storage_ptr__ =
         (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *)DataOffset;
    local_160.Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01127b90;
    local_160.Current.HdrData = (HeaderData *)0x0;
    local_160.DataOffset = 0;
    local_160.Data = 0;
    local_160.NumData = 0;
    local_160.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         &local_160.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
    local_160.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
    make_range<llvm::AppleAcceleratorTable::ValueIterator>
              ((iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *)DataOffset,&local_228,
               &local_160);
    DWARFAcceleratorTable::Entry::~Entry(&local_160.Current.super_Entry);
    this_01 = &local_228.Current.super_Entry;
  }
LAB_00d75674:
  DWARFAcceleratorTable::Entry::~Entry(this_01);
  return __return_storage_ptr__;
}

Assistant:

iterator_range<AppleAcceleratorTable::ValueIterator>
AppleAcceleratorTable::equal_range(StringRef Key) const {
  if (!IsValid)
    return make_range(ValueIterator(), ValueIterator());

  // Find the bucket.
  unsigned HashValue = djbHash(Key);
  unsigned Bucket = HashValue % Hdr.BucketCount;
  uint64_t BucketBase = sizeof(Hdr) + Hdr.HeaderDataLength;
  uint64_t HashesBase = BucketBase + Hdr.BucketCount * 4;
  uint64_t OffsetsBase = HashesBase + Hdr.HashCount * 4;

  uint64_t BucketOffset = BucketBase + Bucket * 4;
  unsigned Index = AccelSection.getU32(&BucketOffset);

  // Search through all hashes in the bucket.
  for (unsigned HashIdx = Index; HashIdx < Hdr.HashCount; ++HashIdx) {
    uint64_t HashOffset = HashesBase + HashIdx * 4;
    uint64_t OffsetsOffset = OffsetsBase + HashIdx * 4;
    uint32_t Hash = AccelSection.getU32(&HashOffset);

    if (Hash % Hdr.BucketCount != Bucket)
      // We are already in the next bucket.
      break;

    uint64_t DataOffset = AccelSection.getU32(&OffsetsOffset);
    uint64_t StringOffset = AccelSection.getRelocatedValue(4, &DataOffset);
    if (!StringOffset)
      break;

    // Finally, compare the key.
    if (Key == StringSection.getCStr(&StringOffset))
      return make_range({*this, DataOffset}, ValueIterator());
  }
  return make_range(ValueIterator(), ValueIterator());
}